

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O2

void gimage::remapImage<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *map)

{
  long k;
  long i;
  long lVar1;
  int d;
  long lVar2;
  
  for (k = 0; k < image->height; k = k + 1) {
    for (lVar1 = 0; lVar1 < image->width; lVar1 = lVar1 + 1) {
      for (lVar2 = 0; lVar2 < image->depth; lVar2 = lVar2 + 1) {
        image->img[lVar2][k][lVar1] = (*map->img[lVar2])[image->img[lVar2][k][lVar1]];
      }
    }
  }
  return;
}

Assistant:

void remapImage(Image<T> &image, const Image<T> &map)
{
  assert(map.getWidth() >= image.absMaxValue()+1);
  assert(map.getDepth() == image.getDepth());

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      if (image.isValid(i, k))
      {
        for (int d=0; d<image.getDepth(); d++)
        {
          image.set(i, k, d, map.get(static_cast<long>(image.get(i, k, d)), 0, d));
        }
      }
    }
  }
}